

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::Data_abi_cxx11_
          (string *__return_storage_ptr__,TextFormatDecodeData *this)

{
  pointer ppVar1;
  CodedOutputStream output_stream;
  OstreamOutputStream data_outputstream;
  ostringstream data_stringstream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&data_stringstream);
  if ((this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->entries_).
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    io::OstreamOutputStream::OstreamOutputStream
              (&data_outputstream,(ostream *)&data_stringstream,-1);
    io::CodedOutputStream::CodedOutputStream
              (&output_stream,&data_outputstream.super_ZeroCopyOutputStream);
    io::CodedOutputStream::WriteVarint32
              (&output_stream,
               (uint32)(((long)(this->entries_).
                               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->entries_).
                              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x28));
    for (ppVar1 = (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar1 != (this->entries_).
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
      io::CodedOutputStream::WriteVarint32(&output_stream,ppVar1->first);
      io::CodedOutputStream::WriteString(&output_stream,&ppVar1->second);
    }
    io::CodedOutputStream::~CodedOutputStream(&output_stream);
    io::OstreamOutputStream::~OstreamOutputStream(&data_outputstream);
  }
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data_stringstream);
  return __return_storage_ptr__;
}

Assistant:

string TextFormatDecodeData::Data() const {
  ostringstream data_stringstream;

  if (num_entries() > 0) {
    io::OstreamOutputStream data_outputstream(&data_stringstream);
    io::CodedOutputStream output_stream(&data_outputstream);

    output_stream.WriteVarint32(num_entries());
    for (vector<DataEntry>::const_iterator i = entries_.begin();
         i != entries_.end(); ++i) {
      output_stream.WriteVarint32(i->first);
      output_stream.WriteString(i->second);
    }
  }

  data_stringstream.flush();
  return data_stringstream.str();
}